

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O3

void __thiscall ItemTable::GreenRoomThree(ItemTable *this)

{
  ItemWrapper *this_00;
  mapped_type *ppIVar1;
  key_type local_64;
  string local_60;
  Item local_40;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Basin","");
  Item::Item(&local_40,&local_60,BASIN);
  ItemWrapper::ItemWrapper(this_00,&local_40,G_ROOM3_BASIN);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.name._M_dataplus._M_p != &local_40.name.field_2) {
    operator_delete(local_40.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_64 = BASIN;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_64);
  *ppIVar1 = this_00;
  return;
}

Assistant:

void ItemTable::GreenRoomThree() {
    ItemWrapper * Basin = new ItemWrapper(Item("Basin", BASIN), G_ROOM3_BASIN);

    items[BASIN] = Basin;
}